

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int _j;
  int iVar6;
  int _i;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  pointer pnVar8;
  pointer pnVar9;
  undefined8 uVar10;
  bool bVar11;
  type_conflict5 tVar12;
  bool bVar13;
  bool strictUp;
  bool strictLo;
  long lVar14;
  double *pdVar15;
  RowSingletonPS *this_00;
  cpp_dec_float<100U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_9d8;
  cpp_dec_float<100U,_int,_void> local_988;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_8c8;
  cpp_dec_float<100U,_int,_void> local_8b8;
  fpclass_type local_868;
  int32_t iStack_864;
  undefined8 uStack_860;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_858;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_808;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_768;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_718;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_678;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_628;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_350;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_300;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  cpp_dec_float<100U,_int,_void> local_260;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_210;
  cpp_dec_float<100U,_int,_void> local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_170;
  cpp_dec_float<100U,_int,_void> local_120;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pNVar7 = row->m_elem;
  aij.m_backend.data._M_elems[0] = (pNVar7->val).m_backend.data._M_elems[0];
  aij.m_backend.data._M_elems[1] = (pNVar7->val).m_backend.data._M_elems[1];
  aij.m_backend.data._M_elems[2] = (pNVar7->val).m_backend.data._M_elems[2];
  aij.m_backend.data._M_elems[3] = (pNVar7->val).m_backend.data._M_elems[3];
  aij.m_backend.data._M_elems[4] = (pNVar7->val).m_backend.data._M_elems[4];
  aij.m_backend.data._M_elems[5] = (pNVar7->val).m_backend.data._M_elems[5];
  aij.m_backend.data._M_elems[6] = (pNVar7->val).m_backend.data._M_elems[6];
  aij.m_backend.data._M_elems[7] = (pNVar7->val).m_backend.data._M_elems[7];
  aij.m_backend.data._M_elems[8] = (pNVar7->val).m_backend.data._M_elems[8];
  aij.m_backend.data._M_elems[9] = (pNVar7->val).m_backend.data._M_elems[9];
  aij.m_backend.data._M_elems[10] = (pNVar7->val).m_backend.data._M_elems[10];
  aij.m_backend.data._M_elems[0xb] = (pNVar7->val).m_backend.data._M_elems[0xb];
  aij.m_backend.data._M_elems[0xc] = (pNVar7->val).m_backend.data._M_elems[0xc];
  aij.m_backend.data._M_elems[0xd] = (pNVar7->val).m_backend.data._M_elems[0xd];
  aij.m_backend.data._M_elems[0xe] = (pNVar7->val).m_backend.data._M_elems[0xe];
  aij.m_backend.data._M_elems[0xf] = (pNVar7->val).m_backend.data._M_elems[0xf];
  iVar3 = (pNVar7->val).m_backend.exp;
  bVar13 = (pNVar7->val).m_backend.neg;
  fVar4 = (pNVar7->val).m_backend.fpclass;
  iVar5 = (pNVar7->val).m_backend.prec_elem;
  _j = pNVar7->idx;
  lVar14 = (long)_j;
  aij.m_backend.exp = iVar3;
  aij.m_backend.neg = bVar13;
  aij.m_backend.fpclass = fVar4;
  aij.m_backend.prec_elem = iVar5;
  pdVar15 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_988,-*pdVar15,(type *)0x0);
  pdVar15 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_9d8,*pdVar15,(type *)0x0);
  local_448.m_backend.data._M_elems[1] = aij.m_backend.data._M_elems[1];
  local_448.m_backend.data._M_elems[0] = aij.m_backend.data._M_elems[0];
  local_448.m_backend.data._M_elems[3] = aij.m_backend.data._M_elems[3];
  local_448.m_backend.data._M_elems[2] = aij.m_backend.data._M_elems[2];
  local_448.m_backend.data._M_elems[5] = aij.m_backend.data._M_elems[5];
  local_448.m_backend.data._M_elems[4] = aij.m_backend.data._M_elems[4];
  local_448.m_backend.data._M_elems[7] = aij.m_backend.data._M_elems[7];
  local_448.m_backend.data._M_elems[6] = aij.m_backend.data._M_elems[6];
  local_448.m_backend.data._M_elems[9] = aij.m_backend.data._M_elems[9];
  local_448.m_backend.data._M_elems[8] = aij.m_backend.data._M_elems[8];
  local_448.m_backend.data._M_elems[0xb] = aij.m_backend.data._M_elems[0xb];
  local_448.m_backend.data._M_elems[10] = aij.m_backend.data._M_elems[10];
  local_448.m_backend.data._M_elems[0xd] = aij.m_backend.data._M_elems[0xd];
  local_448.m_backend.data._M_elems[0xc] = aij.m_backend.data._M_elems[0xc];
  local_448.m_backend.data._M_elems[0xf] = aij.m_backend.data._M_elems[0xf];
  local_448.m_backend.data._M_elems[0xe] = aij.m_backend.data._M_elems[0xe];
  local_448.m_backend.exp = iVar3;
  local_448.m_backend.neg = bVar13;
  local_448.m_backend.fpclass = fVar4;
  local_448.m_backend.prec_elem = iVar5;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_80,0.0,(type *)0x0);
  epsZero(&local_d0,this);
  bVar11 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_448,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_80,&local_d0);
  if (bVar11) {
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_8b8,-*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator<=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_8b8);
    if (tVar12) {
      pdVar15 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar15,(type *)0x0);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result.m_backend,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&aij.m_backend);
    }
    local_988.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
    local_988.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
    local_988.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
    local_988.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
    local_988.data._M_elems[8] = result.m_backend.data._M_elems[8];
    local_988.data._M_elems[9] = result.m_backend.data._M_elems[9];
    local_988.data._M_elems[10] = result.m_backend.data._M_elems[10];
    local_988.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
    local_988.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_988.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_988.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_988.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_988.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_988.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_988.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_988.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_988.exp = result.m_backend.exp;
    local_988.neg = result.m_backend.neg;
    local_988.fpclass = result.m_backend.fpclass;
    local_988.prec_elem = result.m_backend.prec_elem;
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_8b8,*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator>=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_8b8);
    if (tVar12) goto LAB_0033ce91;
    u = &(lp->
         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).right.val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
LAB_0033cebd:
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&result.m_backend,u,&aij.m_backend);
  }
  else {
    local_498.m_backend.data._M_elems[1] = aij.m_backend.data._M_elems[1];
    local_498.m_backend.data._M_elems[0] = aij.m_backend.data._M_elems[0];
    local_498.m_backend.data._M_elems[3] = aij.m_backend.data._M_elems[3];
    local_498.m_backend.data._M_elems[2] = aij.m_backend.data._M_elems[2];
    local_498.m_backend.data._M_elems[5] = aij.m_backend.data._M_elems[5];
    local_498.m_backend.data._M_elems[4] = aij.m_backend.data._M_elems[4];
    local_498.m_backend.data._M_elems[7] = aij.m_backend.data._M_elems[7];
    local_498.m_backend.data._M_elems[6] = aij.m_backend.data._M_elems[6];
    local_498.m_backend.data._M_elems[9] = aij.m_backend.data._M_elems[9];
    local_498.m_backend.data._M_elems[8] = aij.m_backend.data._M_elems[8];
    local_498.m_backend.data._M_elems[0xb] = aij.m_backend.data._M_elems[0xb];
    local_498.m_backend.data._M_elems[10] = aij.m_backend.data._M_elems[10];
    local_498.m_backend.data._M_elems[0xd] = aij.m_backend.data._M_elems[0xd];
    local_498.m_backend.data._M_elems[0xc] = aij.m_backend.data._M_elems[0xc];
    local_498.m_backend.data._M_elems[0xf] = aij.m_backend.data._M_elems[0xf];
    local_498.m_backend.data._M_elems[0xe] = aij.m_backend.data._M_elems[0xe];
    local_498.m_backend.exp = iVar3;
    local_498.m_backend.neg = bVar13;
    local_498.m_backend.fpclass = fVar4;
    local_498.m_backend.prec_elem = iVar5;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_120,0.0,(type *)0x0);
    epsZero(&local_170,this);
    bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_498,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_120,&local_170);
    if (!bVar13) {
      iVar3 = *i;
      pnVar8 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar3].m_backend.data;
      local_4e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar8[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 4;
      local_4e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_4e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 8;
      local_4e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_4e8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 0xc;
      local_4e8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_4e8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_4e8.m_backend.exp = pnVar8[iVar3].m_backend.exp;
      local_4e8.m_backend.neg = pnVar8[iVar3].m_backend.neg;
      local_4e8.m_backend.fpclass = pnVar8[iVar3].m_backend.fpclass;
      local_4e8.m_backend.prec_elem = pnVar8[iVar3].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_1c0,0.0,(type *)0x0);
      feastol(&local_210,this);
      bVar13 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_4e8,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1c0,&local_210);
      if (bVar13) {
        return INFEASIBLE;
      }
      iVar3 = *i;
      pnVar8 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_538.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[iVar3].m_backend.data;
      local_538.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(pnVar8[iVar3].m_backend.data._M_elems + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 4;
      local_538.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_538.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 8;
      local_538.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_538.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = pnVar8[iVar3].m_backend.data._M_elems + 0xc;
      local_538.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_538.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_538.m_backend.exp = pnVar8[iVar3].m_backend.exp;
      local_538.m_backend.neg = pnVar8[iVar3].m_backend.neg;
      local_538.m_backend.fpclass = pnVar8[iVar3].m_backend.fpclass;
      local_538.m_backend.prec_elem = pnVar8[iVar3].m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&local_260,0.0,(type *)0x0);
      feastol(&local_2b0,this);
      bVar13 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_538,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_260,&local_2b0);
      if (bVar13) {
        return INFEASIBLE;
      }
      goto LAB_0033cf38;
    }
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_8b8,*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator>=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_8b8);
    if (tVar12) {
      pdVar15 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar15,(type *)0x0);
    }
    else {
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&result.m_backend,
                 &(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[*i].m_backend,&aij.m_backend);
    }
    local_988.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
    local_988.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
    local_988.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
    local_988.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
    local_988.data._M_elems[8] = result.m_backend.data._M_elems[8];
    local_988.data._M_elems[9] = result.m_backend.data._M_elems[9];
    local_988.data._M_elems[10] = result.m_backend.data._M_elems[10];
    local_988.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
    local_988.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_988.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_988.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_988.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_988.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_988.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_988.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_988.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_988.exp = result.m_backend.exp;
    local_988.neg = result.m_backend.neg;
    local_988.fpclass = result.m_backend.fpclass;
    local_988.prec_elem = result.m_backend.prec_elem;
    iVar3 = *i;
    pnVar8 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&local_8b8,-*pdVar15,(type *)0x0);
    tVar12 = boost::multiprecision::operator<=
                       (pnVar8 + iVar3,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_8b8);
    if (!tVar12) {
      u = &(lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).left.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[*i].m_backend;
      goto LAB_0033cebd;
    }
LAB_0033ce91:
    pdVar15 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,*pdVar15,(type *)0x0);
  }
  local_9d8.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
  local_9d8.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
  local_9d8.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
  local_9d8.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
  local_9d8.data._M_elems[8] = result.m_backend.data._M_elems[8];
  local_9d8.data._M_elems[9] = result.m_backend.data._M_elems[9];
  local_9d8.data._M_elems[10] = result.m_backend.data._M_elems[10];
  local_9d8.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
  local_9d8.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_9d8.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_9d8.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_9d8.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_9d8.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_9d8.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_9d8.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_9d8.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_9d8.exp = result.m_backend.exp;
  local_9d8.neg = result.m_backend.neg;
  local_9d8.fpclass = result.m_backend.fpclass;
  local_9d8.prec_elem = result.m_backend.prec_elem;
LAB_0033cf38:
  local_588.m_backend.data._M_elems[1] = local_988.data._M_elems[1];
  local_588.m_backend.data._M_elems[0] = local_988.data._M_elems[0];
  local_588.m_backend.data._M_elems[3] = local_988.data._M_elems[3];
  local_588.m_backend.data._M_elems[2] = local_988.data._M_elems[2];
  local_588.m_backend.data._M_elems[5] = local_988.data._M_elems[5];
  local_588.m_backend.data._M_elems[4] = local_988.data._M_elems[4];
  local_588.m_backend.data._M_elems[7] = local_988.data._M_elems[7];
  local_588.m_backend.data._M_elems[6] = local_988.data._M_elems[6];
  local_588.m_backend.data._M_elems[9] = local_988.data._M_elems[9];
  local_588.m_backend.data._M_elems[8] = local_988.data._M_elems[8];
  local_588.m_backend.data._M_elems[0xb] = local_988.data._M_elems[0xb];
  local_588.m_backend.data._M_elems[10] = local_988.data._M_elems[10];
  local_588.m_backend.data._M_elems[0xd] = local_988.data._M_elems[0xd];
  local_588.m_backend.data._M_elems[0xc] = local_988.data._M_elems[0xc];
  local_588.m_backend.data._M_elems[0xf] = local_988.data._M_elems[0xf];
  local_588.m_backend.data._M_elems[0xe] = local_988.data._M_elems[0xe];
  local_588.m_backend.exp = local_988.exp;
  local_588.m_backend.neg = local_988.neg;
  local_588.m_backend.fpclass = local_988.fpclass;
  local_588.m_backend.prec_elem = local_988.prec_elem;
  epsZero(&local_300,this);
  bVar13 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_588,&local_300);
  if (bVar13) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_988,0.0);
  }
  local_5d8.m_backend.data._M_elems[0xc] = local_9d8.data._M_elems[0xc];
  local_5d8.m_backend.data._M_elems[0xd] = local_9d8.data._M_elems[0xd];
  local_5d8.m_backend.data._M_elems[0xe] = local_9d8.data._M_elems[0xe];
  local_5d8.m_backend.data._M_elems[0xf] = local_9d8.data._M_elems[0xf];
  local_5d8.m_backend.data._M_elems[8] = local_9d8.data._M_elems[8];
  local_5d8.m_backend.data._M_elems[9] = local_9d8.data._M_elems[9];
  local_5d8.m_backend.data._M_elems[10] = local_9d8.data._M_elems[10];
  local_5d8.m_backend.data._M_elems[0xb] = local_9d8.data._M_elems[0xb];
  local_5d8.m_backend.data._M_elems[4] = local_9d8.data._M_elems[4];
  local_5d8.m_backend.data._M_elems[5] = local_9d8.data._M_elems[5];
  local_5d8.m_backend.data._M_elems[6] = local_9d8.data._M_elems[6];
  local_5d8.m_backend.data._M_elems[7] = local_9d8.data._M_elems[7];
  local_5d8.m_backend.data._M_elems[0] = local_9d8.data._M_elems[0];
  local_5d8.m_backend.data._M_elems[1] = local_9d8.data._M_elems[1];
  local_5d8.m_backend.data._M_elems[2] = local_9d8.data._M_elems[2];
  local_5d8.m_backend.data._M_elems[3] = local_9d8.data._M_elems[3];
  local_5d8.m_backend.exp = local_9d8.exp;
  local_5d8.m_backend.neg = local_9d8.neg;
  local_5d8.m_backend.fpclass = local_9d8.fpclass;
  local_5d8.m_backend.prec_elem = local_9d8.prec_elem;
  epsZero(&local_350,this);
  bVar13 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_5d8,&local_350);
  if (bVar13) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_9d8,0.0);
  }
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar9 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  result.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  result.m_backend.data._M_elems._8_8_ = *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2)
  ;
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  result.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  result.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 8;
  result.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
  result.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 0xc;
  result.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
  uVar10 = *(undefined8 *)(puVar2 + 2);
  result.m_backend.data._M_elems[0xe] = (uint)uVar10;
  result.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
  iVar3 = pnVar8[lVar14].m_backend.exp;
  bVar13 = pnVar8[lVar14].m_backend.neg;
  local_868 = pnVar8[lVar14].m_backend.fpclass;
  iStack_864 = pnVar8[lVar14].m_backend.prec_elem;
  uStack_860 = 0;
  local_8b8.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar14].m_backend.data;
  local_8b8.data._M_elems._8_8_ = *(undefined8 *)(pnVar9[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 4;
  local_8b8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_8b8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 8;
  local_8b8.data._M_elems._32_8_ = *(undefined8 *)puVar2;
  local_8b8.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 0xc;
  local_8b8.data._M_elems._48_8_ = *(undefined8 *)puVar2;
  local_8b8.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
  iVar6 = pnVar9[lVar14].m_backend.exp;
  bVar11 = pnVar9[lVar14].m_backend.neg;
  fVar4 = pnVar9[lVar14].m_backend.fpclass;
  iVar5 = pnVar9[lVar14].m_backend.prec_elem;
  local_628.m_backend.data._M_elems[0xc] = local_9d8.data._M_elems[0xc];
  local_628.m_backend.data._M_elems[0xd] = local_9d8.data._M_elems[0xd];
  local_628.m_backend.data._M_elems[0xe] = local_9d8.data._M_elems[0xe];
  local_628.m_backend.data._M_elems[0xf] = local_9d8.data._M_elems[0xf];
  local_628.m_backend.data._M_elems[8] = local_9d8.data._M_elems[8];
  local_628.m_backend.data._M_elems[9] = local_9d8.data._M_elems[9];
  local_628.m_backend.data._M_elems[10] = local_9d8.data._M_elems[10];
  local_628.m_backend.data._M_elems[0xb] = local_9d8.data._M_elems[0xb];
  local_628.m_backend.data._M_elems[4] = local_9d8.data._M_elems[4];
  local_628.m_backend.data._M_elems[5] = local_9d8.data._M_elems[5];
  local_628.m_backend.data._M_elems[6] = local_9d8.data._M_elems[6];
  local_628.m_backend.data._M_elems[7] = local_9d8.data._M_elems[7];
  local_628.m_backend.data._M_elems[0] = local_9d8.data._M_elems[0];
  local_628.m_backend.data._M_elems[1] = local_9d8.data._M_elems[1];
  local_628.m_backend.data._M_elems[2] = local_9d8.data._M_elems[2];
  local_628.m_backend.data._M_elems[3] = local_9d8.data._M_elems[3];
  local_628.m_backend.exp = local_9d8.exp;
  local_628.m_backend.neg = local_9d8.neg;
  local_628.m_backend.fpclass = local_9d8.fpclass;
  local_628.m_backend.prec_elem = local_9d8.prec_elem;
  local_678.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar9[lVar14].m_backend.data;
  local_678.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar9[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 4;
  local_678.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_678.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 8;
  local_678.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
  local_678.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar9[lVar14].m_backend.data._M_elems + 0xc;
  local_678.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
  local_678.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
  local_678.m_backend.exp = iVar6;
  local_678.m_backend.neg = bVar11;
  local_678.m_backend.fpclass = fVar4;
  local_678.m_backend.prec_elem = iVar5;
  feastol(&local_3a0,this);
  strictUp = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_628,&local_678,&local_3a0);
  if (strictUp) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp,lVar14,&local_9d8,0);
  }
  local_6c8.m_backend.data._M_elems[1] = local_988.data._M_elems[1];
  local_6c8.m_backend.data._M_elems[0] = local_988.data._M_elems[0];
  local_6c8.m_backend.data._M_elems[3] = local_988.data._M_elems[3];
  local_6c8.m_backend.data._M_elems[2] = local_988.data._M_elems[2];
  local_6c8.m_backend.data._M_elems[5] = local_988.data._M_elems[5];
  local_6c8.m_backend.data._M_elems[4] = local_988.data._M_elems[4];
  local_6c8.m_backend.data._M_elems[7] = local_988.data._M_elems[7];
  local_6c8.m_backend.data._M_elems[6] = local_988.data._M_elems[6];
  local_6c8.m_backend.data._M_elems[9] = local_988.data._M_elems[9];
  local_6c8.m_backend.data._M_elems[8] = local_988.data._M_elems[8];
  local_6c8.m_backend.data._M_elems[0xb] = local_988.data._M_elems[0xb];
  local_6c8.m_backend.data._M_elems[10] = local_988.data._M_elems[10];
  local_6c8.m_backend.data._M_elems[0xd] = local_988.data._M_elems[0xd];
  local_6c8.m_backend.data._M_elems[0xc] = local_988.data._M_elems[0xc];
  local_6c8.m_backend.data._M_elems[0xf] = local_988.data._M_elems[0xf];
  local_6c8.m_backend.data._M_elems[0xe] = local_988.data._M_elems[0xe];
  local_6c8.m_backend.exp = local_988.exp;
  local_6c8.m_backend.neg = local_988.neg;
  local_6c8.m_backend.fpclass = local_988.fpclass;
  local_6c8.m_backend.prec_elem = local_988.prec_elem;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_718.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  local_718.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  local_718.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_718.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 8;
  local_718.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
  local_718.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 0xc;
  local_718.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
  local_718.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
  local_718.m_backend.exp = pnVar8[lVar14].m_backend.exp;
  local_718.m_backend.neg = pnVar8[lVar14].m_backend.neg;
  local_718.m_backend.fpclass = pnVar8[lVar14].m_backend.fpclass;
  local_718.m_backend.prec_elem = pnVar8[lVar14].m_backend.prec_elem;
  feastol(&local_3f0,this);
  strictLo = GTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_6c8,&local_718,&local_3f0);
  if (strictLo) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,lVar14,&local_988,0);
  }
  this_00 = (RowSingletonPS *)operator_new(0x2d8);
  _i = *i;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_768.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  local_768.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  local_768.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_768.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 8;
  local_768.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
  local_768.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 0xc;
  local_768.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
  local_768.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
  local_768.m_backend.exp = pnVar8[lVar14].m_backend.exp;
  local_768.m_backend.neg = pnVar8[lVar14].m_backend.neg;
  local_768.m_backend.fpclass = pnVar8[lVar14].m_backend.fpclass;
  local_768.m_backend.prec_elem = pnVar8[lVar14].m_backend.prec_elem;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).up.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_7b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar8[lVar14].m_backend.data;
  local_7b8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar8[lVar14].m_backend.data._M_elems + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 4;
  local_7b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
  local_7b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 8;
  local_7b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
  local_7b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
  puVar2 = pnVar8[lVar14].m_backend.data._M_elems + 0xc;
  local_7b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
  local_7b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
  local_7b8.m_backend.exp = pnVar8[lVar14].m_backend.exp;
  local_7b8.m_backend.neg = pnVar8[lVar14].m_backend.neg;
  local_7b8.m_backend.fpclass = pnVar8[lVar14].m_backend.fpclass;
  local_7b8.m_backend.prec_elem = pnVar8[lVar14].m_backend.prec_elem;
  local_808.m_backend.data._M_elems[0xf] = result.m_backend.data._M_elems[0xf];
  local_808.m_backend.data._M_elems[0xe] = result.m_backend.data._M_elems[0xe];
  local_808.m_backend.data._M_elems[0xc] = result.m_backend.data._M_elems[0xc];
  local_808.m_backend.data._M_elems[0xd] = result.m_backend.data._M_elems[0xd];
  local_808.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
  local_808.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
  local_808.m_backend.data._M_elems[10] = result.m_backend.data._M_elems[10];
  local_808.m_backend.data._M_elems[0xb] = result.m_backend.data._M_elems[0xb];
  local_808.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_808.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_808.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
  local_808.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
  local_808.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_808.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_808.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_808.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_808.m_backend.fpclass = local_868;
  local_808.m_backend.prec_elem = iStack_864;
  local_858.m_backend.data._M_elems[0xc] = local_8b8.data._M_elems[0xc];
  local_858.m_backend.data._M_elems[0xd] = local_8b8.data._M_elems[0xd];
  local_858.m_backend.data._M_elems[0xe] = local_8b8.data._M_elems[0xe];
  local_858.m_backend.data._M_elems[0xf] = local_8b8.data._M_elems[0xf];
  local_858.m_backend.data._M_elems[8] = local_8b8.data._M_elems[8];
  local_858.m_backend.data._M_elems[9] = local_8b8.data._M_elems[9];
  local_858.m_backend.data._M_elems[10] = local_8b8.data._M_elems[10];
  local_858.m_backend.data._M_elems[0xb] = local_8b8.data._M_elems[0xb];
  local_858.m_backend.data._M_elems[4] = local_8b8.data._M_elems[4];
  local_858.m_backend.data._M_elems[5] = local_8b8.data._M_elems[5];
  local_858.m_backend.data._M_elems[6] = local_8b8.data._M_elems[6];
  local_858.m_backend.data._M_elems[7] = local_8b8.data._M_elems[7];
  local_858.m_backend.data._M_elems[0] = local_8b8.data._M_elems[0];
  local_858.m_backend.data._M_elems[1] = local_8b8.data._M_elems[1];
  local_858.m_backend.data._M_elems[2] = local_8b8.data._M_elems[2];
  local_858.m_backend.data._M_elems[3] = local_8b8.data._M_elems[3];
  local_858.m_backend.exp = iVar6;
  local_858.m_backend.neg = bVar11;
  local_858.m_backend.fpclass = fVar4;
  local_858.m_backend.prec_elem = iVar5;
  local_808.m_backend.exp = iVar3;
  local_808.m_backend.neg = bVar13;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_8c8,
             &(this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RowSingletonPS::RowSingletonPS
            (this_00,lp,_i,_j,strictLo,strictUp,&local_768,&local_7b8,&local_808,&local_858,
             (shared_ptr<soplex::Tolerances> *)&local_8c8);
  std::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS,void>
            ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              *)&ptr,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8c8._M_refcount);
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  removeRow(this,lp,*i);
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remRows;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).m_remNzos;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->m_stat).data + 2;
  *piVar1 = *piVar1 + 1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}